

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tree.cpp
# Opt level: O1

void __thiscall libtorrent::aux::merkle_tree::optimize_storage_piece_layer(merkle_tree *this)

{
  libtorrent *this_00;
  pointer pdVar1;
  digest32<256L> *pdVar2;
  _Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> _Var3;
  bool bVar4;
  int iVar5;
  difference_type extraout_RDX;
  __normal_iterator<libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
  __first;
  long lVar6;
  digest32<256L> *this_01;
  digest32<256L> *pdVar7;
  span<const_libtorrent::digest32<256L>_> tree;
  vector<sha256_hash> new_tree;
  allocator_type local_41;
  void *local_40 [2];
  long local_30;
  
  if (this->m_mode != full_tree) {
    return;
  }
  iVar5 = merkle_num_leafs(this->m_num_blocks + (1 << (this->m_blocks_per_piece_log & 0x1f)) + -1 >>
                           (this->m_blocks_per_piece_log & 0x1f));
  if (this->m_blocks_per_piece_log == '\0') {
    return;
  }
  this_00 = (libtorrent *)
            (this->m_tree).
            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar5 = merkle_num_nodes(iVar5);
  tree.m_ptr = (digest32<256L> *)(long)iVar5;
  tree.m_len = extraout_RDX;
  bVar4 = merkle_validate_single_layer(this_00,tree);
  if (!bVar4) {
    return;
  }
  pdVar1 = (this->m_tree).
           super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar5 = merkle_num_leafs(this->m_num_blocks);
  iVar5 = merkle_first_leaf(iVar5);
  this_01 = pdVar1 + iVar5;
  pdVar2 = (this->m_tree).
           super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)pdVar2 - (long)this_01 >> 7;
  if (0 < lVar6) {
    lVar6 = lVar6 + 1;
    do {
      bVar4 = digest32<256L>::is_all_zeros(this_01);
      pdVar7 = this_01;
      if (!bVar4) goto LAB_00229aff;
      bVar4 = digest32<256L>::is_all_zeros(this_01 + 1);
      pdVar7 = this_01 + 1;
      if (!bVar4) goto LAB_00229aff;
      bVar4 = digest32<256L>::is_all_zeros(this_01 + 2);
      pdVar7 = this_01 + 2;
      if (!bVar4) goto LAB_00229aff;
      bVar4 = digest32<256L>::is_all_zeros(this_01 + 3);
      pdVar7 = this_01 + 3;
      if (!bVar4) goto LAB_00229aff;
      this_01 = this_01 + 4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  lVar6 = (long)pdVar2 - (long)this_01 >> 5;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      pdVar7 = pdVar2;
      if ((lVar6 != 3) || (bVar4 = digest32<256L>::is_all_zeros(this_01), pdVar7 = this_01, !bVar4))
      goto LAB_00229aff;
      this_01 = this_01 + 1;
    }
    bVar4 = digest32<256L>::is_all_zeros(this_01);
    pdVar7 = this_01;
    if (!bVar4) goto LAB_00229aff;
    this_01 = this_01 + 1;
  }
  bVar4 = digest32<256L>::is_all_zeros(this_01);
  pdVar7 = this_01;
  if (bVar4) {
    pdVar7 = pdVar2;
  }
LAB_00229aff:
  if (pdVar7 == pdVar2) {
    iVar5 = merkle_num_leafs(this->m_num_blocks + (1 << (this->m_blocks_per_piece_log & 0x1f)) + -1
                             >> (this->m_blocks_per_piece_log & 0x1f));
    iVar5 = merkle_first_leaf(iVar5);
    __first._M_current =
         (this->m_tree).
         super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
         ._M_impl.super__Vector_impl_data._M_start + iVar5;
    ::std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>::
    vector<__gnu_cxx::__normal_iterator<libtorrent::digest32<256l>*,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,void>
              ((vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>> *)
               local_40,__first,
               __first._M_current +
               (this->m_num_blocks + (1 << (this->m_blocks_per_piece_log & 0x1f)) + -1 >>
               (this->m_blocks_per_piece_log & 0x1f)),&local_41);
    ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
    _M_move_assign(&(this->m_tree).
                    super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                   ,(vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>> *
                    )local_40);
    this->m_mode = piece_layer;
    _Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
         (this->m_block_verified).m_buf.
         super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>;
    (this->m_block_verified).m_buf.
    super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
    super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
    super__Head_base<0UL,_unsigned_int_*,_false> = (_Head_base<0UL,_unsigned_int_*,_false>)0x0;
    if (_Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl != (uint *)0x0) {
      operator_delete__((void *)_Var3.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl);
    }
    if (local_40[0] != (void *)0x0) {
      operator_delete(local_40[0],local_30 - (long)local_40[0]);
    }
  }
  return;
}

Assistant:

void merkle_tree::optimize_storage_piece_layer()
	{
		INVARIANT_CHECK;
		if (m_mode != mode_t::full_tree) return;

		// if we have *any* blocks, we can't transition into piece layer mode,
		// since we would lose those hashes
		int const piece_layer_size = merkle_num_leafs(num_pieces());
		if (m_blocks_per_piece_log > 0
			&& merkle_validate_single_layer(span<sha256_hash const>(m_tree).subspan(0, merkle_num_nodes(piece_layer_size)))
			&& std::all_of(m_tree.begin() + block_layer_start(), m_tree.end(), [](sha256_hash const& h) { return h.is_all_zeros(); })
			)
		{
			int const start = piece_layer_start();
			aux::vector<sha256_hash> new_tree(m_tree.begin() + start, m_tree.begin() + start + num_pieces());

			m_tree = std::move(new_tree);
			m_mode = mode_t::piece_layer;
			m_block_verified.clear();
			return;
		}
	}